

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O2

void logUnsigned<unsigned_long>(void)

{
  Session *this;
  atomic<unsigned_long> eventSourceId;
  cx_string<4UL> cVar1;
  SessionWriter *pSVar2;
  __atomic_base<unsigned_long> _Var3;
  nanoseconds clock;
  unsigned_long b;
  unsigned_long a;
  allocator local_105;
  allocator local_104;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  unsigned_long local_100 [3];
  undefined4 local_e8;
  char local_e4;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  local_100[1] = 0x14;
  local_100[0] = 0x1e;
  pSVar2 = binlog::default_thread_local_writer();
  if ((pSVar2->_session->_minSeverity)._M_i < 0x81) {
    if (logUnsigned<unsigned_long>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar2 = binlog::default_thread_local_writer();
      this = pSVar2->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",&local_101);
      std::__cxx11::string::string(local_b0,"logUnsigned",&local_102);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_103);
      local_70 = 0x15;
      std::__cxx11::string::string(local_68,"{} {} {} {}",&local_104);
      local_100[2] = 0x28;
      cVar1 = binlog::detail::
              concatenated_tags<char_const(&)[12],unsigned_long&,unsigned_long_const&,unsigned_long_const&,unsigned_long>
                        ((char (*) [12])"{} {} {} {}",local_100 + 1,local_100,local_100,
                         local_100 + 2);
      local_e8 = cVar1._data._0_4_;
      local_e4 = cVar1._data[4];
      std::__cxx11::string::string(local_48,(char *)&local_e8,&local_105);
      _Var3._M_i = binlog::Session::addEventSource(this,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      logUnsigned<unsigned_long>::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         logUnsigned<unsigned_long>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar2 = binlog::default_thread_local_writer();
    clock = binlog::clockSinceEpoch();
    local_100[2] = 0x28;
    binlog::SessionWriter::
    addEvent<unsigned_long&,unsigned_long_const&,unsigned_long_const&,unsigned_long>
              (pSVar2,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r,
               local_100 + 1,local_100,local_100,local_100 + 2);
  }
  return;
}

Assistant:

void logUnsigned()
{
  T a = 20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(40));
}